

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O1

bool __thiscall rotate_y::hit(rotate_y *this,ray *r,double t_min,double t_max,hit_record *rec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar14 = (r->dir).e[1];
  dVar1 = this->sin_theta;
  dVar2 = this->cos_theta;
  dVar3 = (r->dir).e[0];
  dVar4 = (r->dir).e[2];
  iVar10 = (**((this->ptr).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_hittable)();
  if (SUB41(iVar10,0) != false) {
    dVar11 = (rec->normal).e[1];
    dVar5 = this->sin_theta;
    dVar6 = this->cos_theta;
    dVar7 = (rec->p).e[0];
    dVar8 = (rec->p).e[2];
    dVar12 = (rec->normal).e[0];
    dVar9 = (rec->normal).e[2];
    dVar13 = dVar6 * dVar12 + dVar5 * dVar9;
    dVar12 = dVar6 * dVar9 - dVar5 * dVar12;
    (rec->p).e[0] = dVar6 * dVar7 + dVar5 * dVar8;
    (rec->p).e[2] = dVar8 * dVar6 - dVar7 * dVar5;
    dVar14 = (dVar1 * dVar3 + dVar2 * dVar4) * dVar12 +
             (dVar2 * dVar3 - dVar4 * dVar1) * dVar13 + dVar14 * dVar11;
    rec->front_face = dVar14 < 0.0;
    if (0.0 <= dVar14) {
      dVar13 = -dVar13;
      dVar11 = -dVar11;
      dVar12 = -dVar12;
    }
    (rec->normal).e[0] = dVar13;
    (rec->normal).e[1] = dVar11;
    (rec->normal).e[2] = dVar12;
  }
  return SUB41(iVar10,0);
}

Assistant:

bool rotate_y::hit(const ray& r, double t_min, double t_max, hit_record& rec) const {
    vec3 origin = r.origin();
    vec3 direction = r.direction();

    origin[0] = cos_theta*r.origin()[0] - sin_theta*r.origin()[2];
    origin[2] = sin_theta*r.origin()[0] + cos_theta*r.origin()[2];

    direction[0] = cos_theta*r.direction()[0] - sin_theta*r.direction()[2];
    direction[2] = sin_theta*r.direction()[0] + cos_theta*r.direction()[2];

    ray rotated_r(origin, direction, r.time());

    if (!ptr->hit(rotated_r, t_min, t_max, rec))
        return false;

    vec3 p = rec.p;
    vec3 normal = rec.normal;

    p[0] =  cos_theta*rec.p[0] + sin_theta*rec.p[2];
    p[2] = -sin_theta*rec.p[0] + cos_theta*rec.p[2];

    normal[0] =  cos_theta*rec.normal[0] + sin_theta*rec.normal[2];
    normal[2] = -sin_theta*rec.normal[0] + cos_theta*rec.normal[2];

    rec.p = p;
    rec.set_face_normal(rotated_r, normal);

    return true;
}